

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

SMBusByte * __thiscall SMBusByte::ToPMBusCommandFrame(SMBusByte *this)

{
  undefined1 uVar1;
  undefined6 uVar2;
  const_reference pvVar3;
  byte *in_RSI;
  SMBusByte *this_local;
  Frame *f;
  
  Frame::Frame((Frame *)this);
  this[1].value = '\v';
  pvVar3 = std::vector<SMBusSignalState,_std::allocator<SMBusSignalState>_>::front
                     ((vector<SMBusSignalState,_std::allocator<SMBusSignalState>_> *)(in_RSI + 8));
  uVar1 = *(undefined1 *)((long)&pvVar3->sample_begin + 1);
  uVar2 = *(undefined6 *)((long)&pvVar3->sample_begin + 2);
  this->value = *(undefined1 *)&pvVar3->sample_begin;
  this->is_acked = (bool)uVar1;
  *(undefined6 *)&this->field_0x2 = uVar2;
  pvVar3 = std::vector<SMBusSignalState,_std::allocator<SMBusSignalState>_>::back
                     ((vector<SMBusSignalState,_std::allocator<SMBusSignalState>_> *)(in_RSI + 8));
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pvVar3->sample_end;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)*in_RSI;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = false;
  if ((in_RSI[1] & 1) != 0) {
    this[1].is_acked = (bool)(this[1].is_acked | 1);
  }
  return this;
}

Assistant:

Frame SMBusByte::ToPMBusCommandFrame() const
{
    Frame f;

    f.mType = FT_CmdPMBus;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = signals.back().sample_end;
    f.mData1 = value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}